

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::Encode
          (FundamentalParameterData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  FundamentalParameterData *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(float)this->m_f32Freq);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32FreqRange);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32EffectiveRadiatedPower);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32PulseRepetitionFreq);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32PulseWidth);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BeamAzimuthCenter);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BeamAzimuthSweep);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BeamElevationCenter);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BeamElevationSweep);
  KDataStream::operator<<(pKVar1,(float)this->m_f32BeamSweepSync);
  return;
}

Assistant:

void FundamentalParameterData::Encode( KDataStream & stream ) const
{
    stream << m_f32Freq
           << m_f32FreqRange
           << m_f32EffectiveRadiatedPower
           << m_f32PulseRepetitionFreq
           << m_f32PulseWidth
           << m_f32BeamAzimuthCenter
           << m_f32BeamAzimuthSweep
           << m_f32BeamElevationCenter
           << m_f32BeamElevationSweep
           << m_f32BeamSweepSync;
}